

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall basist::ktx2_transcoder::start_transcoding(ktx2_transcoder *this)

{
  bool bVar1;
  uint32_t uVar2;
  endpoint_vec *this_00;
  vector<basist::ktx2_etc1s_image_desc> *in_RDI;
  uint32_t i;
  ktx2_transcoder *in_stack_00000098;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar3;
  uint local_14;
  vector<basist::ktx2_etc1s_image_desc> *this_01;
  
  if (in_RDI->m_p == (ktx2_etc1s_image_desc *)0x0) {
    return false;
  }
  this_01 = in_RDI;
  uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)in_RDI);
  if (uVar2 == 1) {
    this_00 = basisu_lowlevel_etc1s_transcoder::get_endpoints
                        ((basisu_lowlevel_etc1s_transcoder *)&in_RDI[0xd].m_size);
    bVar1 = basisu::vector<basist::endpoint>::empty(this_00);
    if (!bVar1) {
      return true;
    }
    bVar1 = decompress_etc1s_global_data(in_stack_00000098);
    if (!bVar1) {
      return false;
    }
    if ((((in_RDI[0x62].m_size & 0x100) == 0) &&
        (uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)this_01),
        uVar2 == 1)) &&
       (uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)this_01),
       1 < uVar2)) {
      local_14 = 0;
      while (uVar3 = local_14,
            uVar2 = basisu::vector<basist::ktx2_etc1s_image_desc>::size
                              ((vector<basist::ktx2_etc1s_image_desc> *)&in_RDI[10].m_size),
            uVar3 < uVar2) {
        basisu::vector<basist::ktx2_etc1s_image_desc>::operator[]
                  (in_RDI,CONCAT44(uVar3,in_stack_ffffffffffffffd8));
        uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)this_01);
        if ((uVar2 & 2) != 0) {
          *(undefined1 *)((long)&in_RDI[0x62].m_size + 1) = 1;
          return true;
        }
        local_14 = local_14 + 1;
      }
    }
  }
  else {
    uVar2 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)this_01);
    if (uVar2 == 2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ktx2_transcoder::start_transcoding()
	{
		if (!m_pData)
		{
			BASISU_DEVEL_ERROR("ktx2_transcoder::start_transcoding: Must call init() first\n");
			return false;
		}

		if (m_header.m_supercompression_scheme == KTX2_SS_BASISLZ) 
		{
			// Check if we've already decompressed the ETC1S global data. If so don't unpack it again.
			if (!m_etc1s_transcoder.get_endpoints().empty())
				return true;

			if (!decompress_etc1s_global_data())
			{
				BASISU_DEVEL_ERROR("ktx2_transcoder::start_transcoding: decompress_etc1s_global_data() failed\n");
				return false;
			}
			
			if (!m_is_video)
			{
				// See if there are any P-frames. If so it must be a video, even if there wasn't a KTXanimData key.
				// Video cannot be a cubemap, and it must be a texture array.
				if ((m_header.m_face_count == 1) && (m_header.m_layer_count > 1))
				{
					for (uint32_t i = 0; i < m_etc1s_image_descs.size(); i++)
					{
						if (m_etc1s_image_descs[i].m_image_flags & KTX2_IMAGE_IS_P_FRAME)
						{
							m_is_video = true;
							break;
						}
					}
				}
			}
		}
		else if (m_header.m_supercompression_scheme == KTX2_SS_ZSTANDARD)
		{
#if !BASISD_SUPPORT_KTX2_ZSTD
			BASISU_DEVEL_ERROR("ktx2_transcoder::start_transcoding: File uses zstd supercompression, but zstd support was not enabled at compilation time (BASISD_SUPPORT_KTX2_ZSTD == 0)\n");
			return false;
#endif
		}

		return true;
	}